

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void lab4(Parser *parser)

{
  size_t *__return_storage_ptr__;
  bool bVar1;
  int iVar2;
  _Setw _Var3;
  ostream *poVar4;
  reference ppVar5;
  pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  *str_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
  *__range1_1;
  int i;
  string local_1e0 [36];
  int local_1bc;
  reference ppStack_1b8;
  int key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  *str;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  *__range1;
  undefined1 local_188 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  pair;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
  hashTable;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  local_70;
  undefined1 local_40 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  table;
  Parser *parser_local;
  
  __return_storage_ptr__ = &hashTable._M_t._M_impl.super__Rb_tree_header._M_node_count;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)parser;
  Parser::getLexer((Lexer *)__return_storage_ptr__,parser);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
         *)local_40,&local_70);
  Lexer::~Lexer((Lexer *)__return_storage_ptr__);
  std::
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
  ::map((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
         *)&pair.second);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
              *)local_188);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
                    *)local_40);
  str = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
                  *)local_40);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&str);
    if (!bVar1) break;
    ppStack_1b8 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
                  ::operator*(&__end1);
    std::__cxx11::string::string(local_1e0,(string *)ppStack_1b8);
    iVar2 = hashFunction((string *)local_1e0);
    std::__cxx11::string::~string(local_1e0);
    local_1bc = iVar2;
    std::pair<std::__cxx11::string,lexemtype>::operator=
              ((pair<std::__cxx11::string,lexemtype> *)local_188,ppStack_1b8);
    std::
    map<int,std::pair<std::__cxx11::string,lexemtype>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,lexemtype>>>>
    ::emplace<int&,std::pair<std::__cxx11::string,lexemtype>&>
              ((map<int,std::pair<std::__cxx11::string,lexemtype>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,lexemtype>>>>
                *)&pair.second,&local_1bc,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
                *)local_188);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
    ::operator++(&__end1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"                Hash lexemes table");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           " Num |    HASHKEY   |  Lexem  |      Definition      |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "-----+--------------+---------+----------------------+");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  __range1_1._4_4_ = 1;
  __end1_1 = std::
             map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
             ::begin((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
                      *)&pair.second);
  str_1 = (pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
           *)std::
             map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
             ::end((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
                    *)&pair.second);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&str_1);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
             ::operator*(&__end1_1);
    _Var3 = std::setw(3);
    poVar4 = std::operator<<((ostream *)&std::cout,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,__range1_1._4_4_);
    poVar4 = std::operator<<(poVar4,". | ");
    _Var3 = std::setw(10);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar5->first);
    poVar4 = std::operator<<(poVar4," . | ");
    _Var3 = std::setw(7);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,(string *)&ppVar5->second);
    poVar4 = std::operator<<(poVar4," | ");
    _Var3 = std::setw(0x14);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = operator<<(poVar4,&(ppVar5->second).second);
    poVar4 = std::operator<<(poVar4," | ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __range1_1._4_4_ = __range1_1._4_4_ + 1;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
    ::operator++(&__end1_1);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
         *)local_188);
  std::
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
  ::~map((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>_>
          *)&pair.second);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
          *)local_40);
  return;
}

Assistant:

void lab4(Parser &parser) {
    map<string, lexemtype> table = parser.getLexer().table;
    map<int, pair<string, lexemtype>> hashTable;
    pair<string, lexemtype> pair;
    for (const auto &str : table) {
        int key = hashFunction(str.first);
        pair = str;
        hashTable.emplace(key, pair);
    }
    cout << "                Hash lexemes table" << endl;
    cout << " Num |    HASHKEY   |  Lexem  |      Definition      |" << endl;
    cout << "-----+--------------+---------+----------------------+" << endl;
    int i = 1;
    for (const auto &str : hashTable) {
        cout << setw(3) << i << ". | " << setw(10) << str.first << " . | " << setw(7)
             << str.second.first << " | " << setw(20) << str.second.second << " | " << endl;
        ++i;
    }
}